

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::lts_20250127::str_format_internal::anon_unknown_0::
     IncrementNibble<absl::lts_20250127::uint128>(size_t nibble_index,uint128 *n)

{
  bool bVar1;
  int amount;
  uint64_t extraout_RDX;
  uint128 uVar2;
  uint128 lhs;
  uint128 lhs_00;
  uint128 val;
  lts_20250127 *local_78;
  uint128 after;
  uint64_t local_60;
  uint128 local_58;
  lts_20250127 *local_48;
  uint64_t local_40;
  undefined1 local_38 [8];
  uint128 before;
  size_t kNumNibbles;
  size_t kShift;
  uint128 *n_local;
  size_t nibble_index_local;
  lts_20250127 *this;
  
  before.hi_ = 0x20;
  this = (lts_20250127 *)n->lo_;
  local_40 = n->hi_;
  uVar2.hi_ = 0x7f;
  uVar2.lo_ = local_40;
  local_48 = this;
  _local_38 = operator>>(this,uVar2,(int)this);
  amount = (int)this;
  if (nibble_index < 0x20) {
    uint128::uint128((uint128 *)&after.hi_,1);
    lhs.hi_ = (nibble_index & 0x3fffffff) << 2;
    lhs.lo_ = local_60;
    local_58 = lts_20250127::operator<<((lts_20250127 *)after.hi_,lhs,amount);
  }
  else {
    uint128::uint128(&local_58,0);
  }
  uint128::operator+=(n,local_58);
  lhs_00.hi_ = 0x7f;
  lhs_00.lo_ = n->hi_;
  uVar2 = operator>>((lts_20250127 *)n->lo_,lhs_00,(int)(lts_20250127 *)n->lo_);
  bVar1 = uint128::operator_cast_to_bool((uint128 *)local_38);
  if (bVar1) {
    local_78 = (lts_20250127 *)uVar2.lo_;
    after.lo_ = uVar2.hi_;
    val.hi_ = extraout_RDX;
    val.lo_ = after.lo_;
    bVar1 = operator!(local_78,val);
    if (bVar1) {
      return true;
    }
  }
  return 0x1f < nibble_index;
}

Assistant:

bool IncrementNibble(size_t nibble_index, Int* n) {
  constexpr size_t kShift = sizeof(Int) * 8 - 1;
  constexpr size_t kNumNibbles = sizeof(Int) * 8 / 4;
  Int before = *n >> kShift;
  // Here we essentially want to take the number 1 and move it into the
  // requested nibble, then add it to *n to effectively increment the nibble.
  // However, ASan will complain if we try to shift the 1 beyond the limits of
  // the Int, i.e., if the nibble_index is out of range. So therefore we check
  // for this and if we are out of range we just add 0 which leaves *n
  // unchanged, which seems like the reasonable thing to do in that case.
  *n += ((nibble_index >= kNumNibbles)
             ? 0
             : (Int{1} << static_cast<int>(nibble_index * 4)));
  Int after = *n >> kShift;
  return (before && !after) || (nibble_index >= kNumNibbles);
}